

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Response.h
# Opt level: O2

basic_ostream<char,_std::char_traits<char>_> *
operator<<(basic_ostream<char,_std::char_traits<char>_> *stream,Response *resp)

{
  long lVar1;
  ostream *poVar2;
  element_type *peVar3;
  unsigned_long i;
  ulong uVar4;
  long *in_FS_OFFSET;
  stringstream ss;
  string local_1d0 [32];
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar2 = std::operator<<(local_1a0,(string *)resp);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,(string *)&resp->status);
  poVar2 = std::operator<<(poVar2,"\r\n");
  poVar2 = std::operator<<(poVar2,"Date: ");
  poVar2 = std::operator<<(poVar2,(string *)&resp->date);
  poVar2 = std::operator<<(poVar2,"\r\n");
  poVar2 = std::operator<<(poVar2,"Server: ");
  poVar2 = std::operator<<(poVar2,(string *)&resp->server);
  poVar2 = std::operator<<(poVar2,"\r\n");
  poVar2 = std::operator<<(poVar2,"Content-Length: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,"\r\n");
  poVar2 = std::operator<<(poVar2,"Connection: ");
  poVar2 = std::operator<<(poVar2,(string *)&resp->connection);
  poVar2 = std::operator<<(poVar2,"\r\n");
  poVar2 = std::operator<<(poVar2,"Content-Type: ");
  poVar2 = std::operator<<(poVar2,(string *)&resp->content_type);
  poVar2 = std::operator<<(poVar2,"\r\n");
  std::operator<<(poVar2,"\r\n");
  std::__cxx11::stringbuf::str();
  std::operator<<(stream,local_1d0);
  std::__cxx11::string::~string(local_1d0);
  if ((resp->body).
      super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    lVar1 = *in_FS_OFFSET + -0x19000;
    for (uVar4 = 0; uVar4 < resp->content_length / 0x19000; uVar4 = uVar4 + 1) {
      std::istream::read((char *)(resp->body).
                                 super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr,lVar1);
      std::ostream::write((char *)stream,lVar1);
    }
    peVar3 = (resp->body).
             super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (resp->content_length % 0x19000 != 0) {
      std::istream::read((char *)peVar3,lVar1);
      std::ostream::write((char *)stream,lVar1);
      peVar3 = (resp->body).
               super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    }
    std::ios::clear((int)peVar3 + (int)*(undefined8 *)(*(long *)peVar3 + -0x18));
    std::istream::seekg((long)(resp->body).
                              super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr,_S_beg);
  }
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return stream;
}

Assistant:

T& operator<<(T& stream, const Response& resp) {
    std::stringstream ss;
    ss  << resp.protocol << " " << resp.status.code    << " " << resp.status.status << "\r\n"
        << "Date: "             << resp.date           << "\r\n"
        << "Server: "           << resp.server         << "\r\n"
        << "Content-Length: "   << resp.content_length << "\r\n"
        << "Connection: "       << resp.connection     << "\r\n"
        << "Content-Type: "     << resp.content_type   << "\r\n"
        << "\r\n";

    stream << ss.str();

    if (resp.body) {
        size_t bytes_count = BUFFER_SIZE * sizeof(Byte); 

        for (unsigned long i = 0; i < resp.content_length / bytes_count; i++) {
            resp.body->read(static_cast<char*>(buff), bytes_count);
            stream.write(static_cast<char*>(buff), bytes_count);
        }
        if (resp.content_length % bytes_count) {
            resp.body->read(static_cast<char*>(buff), resp.content_length % bytes_count);
            stream.write(static_cast<char*>(buff), resp.content_length % bytes_count);
        }

        resp.body->clear();
        resp.body->seekg(0, std::ios::beg);
    }

    return stream;
}